

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
::
emplace_decomposable_with_hash<phmap::priv::hash_internal::EnumClass,std::piecewise_construct_t_const&,std::tuple<phmap::priv::hash_internal::EnumClass_const&>,std::tuple<int_const&>>
          (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
          *this,EnumClass *key,size_t hashval,piecewise_construct_t *args,
          tuple<const_phmap::priv::hash_internal::EnumClass_&> *args_1,tuple<const_int_&> *args_2)

{
  raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  *this_00;
  int *piVar1;
  slot_type *pptVar2;
  size_t sVar3;
  size_t i;
  slot_type ptVar4;
  ctrl_t *pcVar5;
  ctrl_t *pcVar6;
  bool bVar7;
  
  this_00 = (raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
             *)(this + (ulong)(((uint)(hashval >> 0x18) & 0xff ^
                               (uint)hashval >> 0x10 ^ (uint)(hashval >> 8) & 0xffffff) & 0xf) *
                       0x48);
  i = raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
      ::_find_key<phmap::priv::hash_internal::EnumClass>(this_00,key,hashval);
  bVar7 = i == 0xffffffffffffffff;
  if (bVar7) {
    i = raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
        ::prepare_insert(this_00,hashval);
    pptVar2 = this_00->slots_;
    ptVar4 = (slot_type)operator_new(0x10);
    piVar1 = (args_2->super__Tuple_impl<0UL,_const_int_&>).super__Head_base<0UL,_const_int_&,_false>
             ._M_head_impl;
    ptVar4->first =
         *(args_1->super__Tuple_impl<0UL,_const_phmap::priv::hash_internal::EnumClass_&>).
          super__Head_base<0UL,_const_phmap::priv::hash_internal::EnumClass_&,_false>._M_head_impl;
    ptVar4->second = *piVar1;
    pptVar2[i] = ptVar4;
    raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
    ::set_ctrl(this_00,i,(byte)hashval & 0x7f);
    pcVar5 = this_00->ctrl_;
    pcVar6 = pcVar5 + i;
  }
  else {
    pcVar5 = this_00->ctrl_;
    pcVar6 = pcVar5 + i;
  }
  pptVar2 = this_00->slots_;
  sVar3 = this_00->capacity_;
  (__return_storage_ptr__->first).inner_ = (Inner *)this_00;
  (__return_storage_ptr__->first).inner_end_ = (Inner *)(this + 0x480);
  (__return_storage_ptr__->first).it_.ctrl_ = pcVar6;
  (__return_storage_ptr__->first).it_.field_1.slot_ = pptVar2 + i;
  (__return_storage_ptr__->first).it_end_.ctrl_ = pcVar5 + sVar3;
  __return_storage_ptr__->second = bVar7;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable_with_hash(const K& key, size_t hashval, Args&&... args)
    {
        Inner& inner   = sets_[subidx(hashval)];
        auto&  set     = inner.set_;
        UniqueLock m(inner);
        
        size_t offset = set._find_key(key, hashval);
        if (offset == (size_t)-1) {
            offset = set.prepare_insert(hashval);
            set.emplace_at(offset, std::forward<Args>(args)...);
            set.set_ctrl(offset, H2(hashval));
            return make_rv(&inner, {set.iterator_at(offset), true});
        }
        return make_rv(&inner, {set.iterator_at(offset), false});
    }